

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O3

void server_instance_terminated(LogPolicy *lp)

{
  if ((listening == '\x01') && (listen_once == '\0')) {
    log_to_stderr(*(uint *)&lp[-3].vt,"connection terminated");
  }
  safefree(lp + -3);
  return;
}

Assistant:

void server_instance_terminated(LogPolicy *lp)
{
    struct server_instance *inst = container_of(
        lp, struct server_instance, logpolicy);

    if (listening && !listen_once) {
        log_to_stderr(inst->id, "connection terminated");
    } else {
        finished = true;
    }

    sfree(inst);
}